

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ScopedNameSyntax::setChild(ScopedNameSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->right).ptr = (NameSyntax *)pSVar1;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->separator).kind = TVar2.kind;
    (this->separator).field_0x2 = TVar2._2_1_;
    (this->separator).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->separator).rawLen = TVar2.rawLen;
    (this->separator).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->left).ptr = (NameSyntax *)pSVar1;
  }
  return;
}

Assistant:

void ScopedNameSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: separator = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}